

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O3

void __thiscall
Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Polynom
          (Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *this,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *summands)

{
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar1;
  initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> cont;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> local_40;
  
  if (summands->_cursor == summands->_stack) {
    Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::zero();
    cont._M_len = 1;
    cont._M_array = &local_40;
    Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Stack
              (&this->_summands,cont);
    mpz_clear(local_40.numeral._den._val);
    mpz_clear((__mpz_struct *)&local_40);
  }
  else {
    (this->_summands)._cursor = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
    (this->_summands)._end = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
    (this->_summands)._capacity = 0;
    (this->_summands)._stack = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
    (this->_summands)._capacity = summands->_capacity;
    summands->_capacity = 0;
    (this->_summands)._cursor = summands->_cursor;
    summands->_cursor = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
    pMVar1 = (this->_summands)._end;
    (this->_summands)._end = summands->_end;
    summands->_end = pMVar1;
    pMVar1 = (this->_summands)._stack;
    (this->_summands)._stack = summands->_stack;
    summands->_stack = pMVar1;
  }
  return;
}

Assistant:

Polynom<Number>::Polynom(Stack<Monom>&& summands) 
  : _summands(
      summands.isEmpty() 
        ? Stack<Monom>{Monom::zero()} 
        : std::move(summands)) 
{ /* integrity(); */ }